

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall CGameClient::UpdatePositions(CGameClient *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  CNetObj_SpectatorInfo *pCVar8;
  CNetObj_SpectatorInfo *pCVar9;
  bool Predicted;
  int iVar10;
  vec2 vVar11;
  
  if (((this->m_Snap).m_pLocalCharacter != (CNetObj_Character *)0x0) &&
     ((this->m_Snap).m_pLocalPrevCharacter != (CNetObj_Character *)0x0)) {
    iVar10 = this->m_LocalClientID;
    Predicted = ShouldUsePredicted(this);
    vVar11 = GetCharPos(this,iVar10,Predicted);
    this->m_LocalCharacterPos = vVar11;
  }
  if ((this->m_Snap).m_SpecInfo.m_Active != true) {
    return;
  }
  if (((this->m_pClient->m_State == 4) &&
      (iVar10 = (*(this->m_pDemoPlayer->super_IInterface)._vptr_IInterface[10])(), iVar10 == 2)) &&
     (iVar10 = (this->m_Snap).m_SpecInfo.m_SpectatorID, iVar10 != -1)) {
    vVar11 = GetCharPos(this,iVar10,false);
  }
  else {
    pCVar8 = (this->m_Snap).m_pSpectatorInfo;
    if (pCVar8 == (CNetObj_SpectatorInfo *)0x0) {
      return;
    }
    if ((this->m_pClient->m_State != 4) && ((this->m_Snap).m_SpecInfo.m_SpecMode == 0)) {
      return;
    }
    pCVar9 = (this->m_Snap).m_pPrevSpectatorInfo;
    if (pCVar9 == (CNetObj_SpectatorInfo *)0x0) {
      uVar4 = pCVar8->m_X;
      uVar7 = pCVar8->m_Y;
      vVar11.field_0.x = (float)(int)uVar4;
      vVar11.field_1.y = (float)(int)uVar7;
    }
    else {
      uVar2 = pCVar9->m_X;
      uVar5 = pCVar9->m_Y;
      uVar3 = pCVar8->m_X;
      uVar6 = pCVar8->m_Y;
      fVar1 = this->m_pClient->m_GameIntraTick;
      vVar11.field_0.x = fVar1 * ((float)(int)uVar3 - (float)(int)uVar2) + (float)(int)uVar2;
      vVar11.field_1.y = fVar1 * ((float)(int)uVar6 - (float)(int)uVar5) + (float)(int)uVar5;
    }
  }
  (this->m_Snap).m_SpecInfo.m_Position = vVar11;
  this->m_LocalCharacterPos = vVar11;
  (this->m_Snap).m_SpecInfo.m_UsePosition = true;
  return;
}

Assistant:

void CGameClient::UpdatePositions()
{
	// `m_LocalCharacterPos` is used for many things besides rendering the
	// player (e.g. camera position, mouse input), which is why we set it here.
	if(m_Snap.m_pLocalCharacter && m_Snap.m_pLocalPrevCharacter)
	{
		m_LocalCharacterPos = GetCharPos(m_LocalClientID, ShouldUsePredicted());
	}

	// spectator position
	if(m_Snap.m_SpecInfo.m_Active)
	{
		if(Client()->State() == IClient::STATE_DEMOPLAYBACK &&
			DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER &&
			m_Snap.m_SpecInfo.m_SpectatorID != -1)
		{
			m_Snap.m_SpecInfo.m_Position = GetCharPos(m_Snap.m_SpecInfo.m_SpectatorID);
			m_LocalCharacterPos = m_Snap.m_SpecInfo.m_Position;
			m_Snap.m_SpecInfo.m_UsePosition = true;
		}
		else if(
			m_Snap.m_pSpectatorInfo &&
			(
				Client()->State() == IClient::STATE_DEMOPLAYBACK ||
				m_Snap.m_SpecInfo.m_SpecMode != SPEC_FREEVIEW ||
				(
					m_Snap.m_pLocalInfo &&
					(m_Snap.m_pLocalInfo->m_PlayerFlags & PLAYERFLAG_DEAD) &&
					m_Snap.m_SpecInfo.m_SpecMode != SPEC_FREEVIEW
				)
			))
		{
			if(m_Snap.m_pPrevSpectatorInfo)
				m_Snap.m_SpecInfo.m_Position = mix(
					vec2(
						m_Snap.m_pPrevSpectatorInfo->m_X,
						m_Snap.m_pPrevSpectatorInfo->m_Y
					),
					vec2(
						m_Snap.m_pSpectatorInfo->m_X,
						m_Snap.m_pSpectatorInfo->m_Y
					),
					Client()->IntraGameTick()
				);
			else
				m_Snap.m_SpecInfo.m_Position = vec2(
					m_Snap.m_pSpectatorInfo->m_X,
					m_Snap.m_pSpectatorInfo->m_Y
				);

			m_LocalCharacterPos = m_Snap.m_SpecInfo.m_Position;
			m_Snap.m_SpecInfo.m_UsePosition = true;
		}
	}
}